

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O0

int ed25519_pub_encode(CBB *out,EVP_PKEY *pkey)

{
  void *pvVar1;
  int iVar2;
  undefined1 local_b8 [8];
  CBB key_bitstring;
  CBB algorithm;
  CBB spki;
  ED25519_KEY *key;
  EVP_PKEY *pkey_local;
  CBB *out_local;
  
  pvVar1 = pkey->pkey;
  iVar2 = CBB_add_asn1(out,(CBB *)((long)&algorithm.u + 0x18),0x20000010);
  if ((((iVar2 != 0) &&
       (iVar2 = CBB_add_asn1((CBB *)((long)&algorithm.u + 0x18),
                             (CBB *)((long)&key_bitstring.u + 0x18),0x20000010), iVar2 != 0)) &&
      (iVar2 = CBB_add_asn1_element
                         ((CBB *)((long)&key_bitstring.u + 0x18),6,ed25519_asn1_meth.oid,3),
      iVar2 != 0)) &&
     (((iVar2 = CBB_add_asn1((CBB *)((long)&algorithm.u + 0x18),(CBB *)local_b8,3), iVar2 != 0 &&
       (iVar2 = CBB_add_u8((CBB *)local_b8,'\0'), iVar2 != 0)) &&
      ((iVar2 = CBB_add_bytes((CBB *)local_b8,(uint8_t *)((long)pvVar1 + 0x20),0x20), iVar2 != 0 &&
       (iVar2 = CBB_flush(out), iVar2 != 0)))))) {
    return 1;
  }
  ERR_put_error(6,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                ,0x8e);
  return 0;
}

Assistant:

static int ed25519_pub_encode(CBB *out, const EVP_PKEY *pkey) {
  const ED25519_KEY *key = reinterpret_cast<const ED25519_KEY *>(pkey->pkey);

  // See RFC 8410, section 4.
  CBB spki, algorithm, key_bitstring;
  if (!CBB_add_asn1(out, &spki, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, ed25519_asn1_meth.oid,
                            ed25519_asn1_meth.oid_len) ||
      !CBB_add_asn1(&spki, &key_bitstring, CBS_ASN1_BITSTRING) ||
      !CBB_add_u8(&key_bitstring, 0 /* padding */) ||
      !CBB_add_bytes(&key_bitstring, key->key + ED25519_PUBLIC_KEY_OFFSET,
                     32) ||
      !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}